

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,true>
               (dtime_tz_t *ldata,interval_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  dtime_tz_t left;
  long lVar3;
  ulong uVar4;
  dtime_tz_t dVar5;
  dtime_tz_t dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ValidityMask *pVVar10;
  ulong uVar11;
  idx_t iVar12;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  dtime_tz_t *local_40;
  dtime_tz_t *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar5.bits._0_4_ = rdata->months;
      dVar5.bits._4_4_ = rdata->days;
      iVar12 = 0;
      lVar3 = rdata->micros;
      do {
        local_44 = 0;
        right_01.micros = (int64_t)&local_44;
        right_01._0_8_ = -lVar3;
        dVar6 = Interval::Add((Interval *)ldata[iVar12].bits,dVar5,right_01,(date_t *)mask);
        result_data[iVar12].bits = dVar6.bits;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar9 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
LAB_0109b710:
        uVar4 = uVar8;
        if (uVar8 < uVar11) {
          dVar6.bits._0_4_ = rdata->months;
          dVar6.bits._4_4_ = rdata->days;
          lVar3 = rdata->micros;
          pVVar10 = mask;
          do {
            local_4c = 0;
            right_00.micros = (int64_t)&local_4c;
            right_00._0_8_ = -lVar3;
            dVar5 = Interval::Add((Interval *)ldata[uVar8].bits,dVar6,right_00,(date_t *)pVVar10);
            result_data[uVar8].bits = dVar5.bits;
            uVar8 = uVar8 + 1;
            uVar4 = uVar11;
          } while (uVar11 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar9];
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
        uVar4 = uVar11;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_0109b710;
          uVar4 = uVar8;
          if (uVar8 < uVar11) {
            local_38 = result_data + uVar8;
            local_40 = ldata + uVar8;
            uVar7 = 0;
            pVVar10 = mask;
            do {
              if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
                left.bits._0_4_ = rdata->months;
                left.bits._4_4_ = rdata->days;
                local_48 = 0;
                right.micros = (int64_t)&local_48;
                right._0_8_ = -rdata->micros;
                dVar5 = Interval::Add((Interval *)local_40[uVar7].bits,left,right,(date_t *)pVVar10)
                ;
                local_38[uVar7].bits = dVar5.bits;
              }
              uVar7 = uVar7 + 1;
              uVar4 = uVar11;
            } while (uVar11 - uVar8 != uVar7);
          }
        }
      }
      uVar8 = uVar4;
      uVar9 = uVar9 + 1;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}